

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::decompressDXT5(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int32 k;
  long lVar16;
  uint32 *puVar17;
  uint32 *puVar18;
  uint32 k_2;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint8 aidx [16];
  uint8 idx [16];
  uint local_c8 [4];
  uint local_b8;
  uint local_b4;
  undefined8 local_b0;
  uint local_a8 [4];
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  undefined8 local_78;
  uint32 a [8];
  uint32 c [4] [4];
  
  if (0 < h * w) {
    uVar11 = (ulong)(uint)(h * w);
    a[2] = (int)uVar11;
    a[3] = (int)(uVar11 >> 0x20);
    uVar14 = 0;
    iVar15 = 0;
    uVar12 = 0;
    do {
      a[4] = (int)uVar12;
      a[5] = (int)(uVar12 >> 0x20);
      uVar3 = *(ushort *)(src + uVar14 + 8);
      uVar4 = *(ushort *)(src + uVar14 + 10);
      uVar9 = (uint)(uVar3 >> 0xb) * 0xff;
      local_a8[0] = uVar9 / 0x1f;
      uVar21 = (uVar3 >> 5 & 0x3f) * 0xff;
      local_a8[1] = uVar21 / 0x3f;
      uVar5 = (uVar3 & 0x1f) * 0xff;
      local_a8[2] = uVar5 / 0x1f;
      uVar6 = (uint)(uVar4 >> 0xb) * 0xff;
      local_98 = uVar6 / 0x1f;
      uVar7 = (uVar4 >> 5 & 0x3f) * 0xff;
      local_94 = uVar7 / 0x3f;
      uVar8 = (uVar4 & 0x1f) * 0xff;
      local_90 = uVar8 / 0x1f;
      if (uVar4 < uVar3) {
        local_88 = (local_98 + local_a8[0] * 2) / 3;
        local_84 = (local_94 + local_a8[1] * 2) / 3;
        local_80 = (local_90 + local_a8[2] * 2) / 3;
        local_78 = CONCAT44((uVar21 / 0x3f + (uVar7 / 0x3f) * 2) / 3,
                            (uVar9 / 0x1f + (uVar6 / 0x1f) * 2) / 3);
        a[0] = (uVar5 / 0x1f + (uVar8 / 0x1f) * 2) / 3;
      }
      else {
        local_88 = local_98 + local_a8[0] >> 1;
        local_84 = local_94 + local_a8[1] >> 1;
        local_80 = local_90 + local_a8[2] >> 1;
        local_78 = 0;
        a[0] = 0;
      }
      bVar1 = src[uVar14];
      uVar21 = (uint)bVar1;
      local_c8[0] = (uint)bVar1;
      bVar2 = src[uVar14 + 1];
      uVar9 = (uint)bVar2;
      local_c8[1] = (uint)bVar2;
      if (bVar2 < bVar1) {
        local_c8[2] = (uVar9 + uVar21 * 6) / 7;
        local_c8[3] = ((uint)bVar2 + (uint)bVar2 + uVar21 * 5) / 7;
        local_b8 = (uVar9 * 3 + uVar21 * 4) / 7;
        local_b4 = (uVar21 * 3 + uVar9 * 4) / 7;
        local_b0 = CONCAT44((uVar21 + uVar9 * 6) / 7,(uVar9 * 5 + uVar21 * 2) / 7);
      }
      else {
        local_c8[2] = (uVar9 + uVar21 * 4) / 5;
        local_c8[3] = ((uint)bVar2 + (uint)bVar2 + uVar21 * 3) / 5;
        local_b8 = (uVar9 * 3 + uVar21 * 2) / 5;
        local_b4 = (uVar21 + uVar9 * 4) / 5;
        local_b0 = 0xff00000000;
      }
      uVar9 = *(uint *)(src + uVar14 + 0xc);
      lVar16 = 0;
      do {
        *(byte *)((long)c[0] + lVar16 + 8) = (byte)uVar9 & 3;
        uVar9 = uVar9 >> 2;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      uVar13 = *(ulong *)(src + uVar14 + 2);
      lVar16 = 0;
      do {
        *(byte *)((long)a + lVar16 + 0x18) = (byte)uVar13 & 7;
        uVar13 = uVar13 >> 3;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      iVar10 = w * (int)uVar12 + iVar15;
      puVar18 = c[0] + 2;
      lVar16 = 0;
      puVar17 = a + 6;
      do {
        lVar19 = 0;
        do {
          uVar13 = (ulong)*(byte *)((long)puVar18 + lVar19);
          uVar20 = (ulong)(uint)(iVar10 + (int)lVar19);
          adst[uVar20 * 4] = (uint8)local_a8[uVar13 * 4];
          adst[uVar20 * 4 + 1] = (uint8)local_a8[uVar13 * 4 + 1];
          adst[uVar20 * 4 + 2] = (uint8)local_a8[uVar13 * 4 + 2];
          adst[uVar20 * 4 + 3] = (uint8)local_c8[*(byte *)((long)puVar17 + lVar19)];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar16 = lVar16 + 1;
        iVar10 = iVar10 + w;
        puVar18 = puVar18 + 1;
        puVar17 = (uint32 *)((long)puVar17 + 4);
      } while (lVar16 != 4);
      iVar15 = iVar15 + 4;
      if (w <= iVar15) {
        iVar15 = 0;
        uVar12 = (ulong)((int)uVar12 + 4);
      }
      uVar14 = uVar14 + 0x10;
    } while (uVar14 < uVar11);
  }
  return;
}

Assistant:

void
decompressDXT5(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint32 a[8];
	uint8 idx[16];
	uint8 aidx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
		}

		a[0] = src[j+0];
		a[1] = src[j+1];
		if(a[0] > a[1]){
			a[2] = (6*a[0] + 1*a[1])/7;
			a[3] = (5*a[0] + 2*a[1])/7;
			a[4] = (4*a[0] + 3*a[1])/7;
			a[5] = (3*a[0] + 4*a[1])/7;
			a[6] = (2*a[0] + 5*a[1])/7;
			a[7] = (1*a[0] + 6*a[1])/7;
		}else{
			a[2] = (4*a[0] + 1*a[1])/5;
			a[3] = (3*a[0] + 2*a[1])/5;
			a[4] = (2*a[0] + 3*a[1])/5;
			a[5] = (1*a[0] + 4*a[1])/5;
			a[6] = 0;
			a[7] = 0xFF;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		// only 6 indices
		uint64 alphas = *((uint64*)&src[j+2]);
		for(int32 k = 0; k < 16; k++){
			aidx[k] = alphas & 0x7;
			alphas >>= 3;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[aidx[l*4+k]];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}